

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O1

void __thiscall rpn::RPNExpression::Evaluate(RPNExpression *this)

{
  pointer puVar1;
  IExpression *pIVar2;
  unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> *expr;
  pointer puVar3;
  EvaluationContext context;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  void *pvStack_60;
  undefined8 local_58;
  long lStack_50;
  char *local_48;
  long local_40;
  char local_38;
  undefined7 uStack_37;
  
  local_58 = 0;
  lStack_50 = 0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvStack_60 = (void *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = 0;
  local_38 = '\0';
  puVar1 = (this->rpnExprList).
           super__Vector_base<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = &local_38;
  for (puVar3 = (this->rpnExprList).
                super__Vector_base<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pIVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<rpn::IExpression,_std::default_delete<rpn::IExpression>_>._M_t.
             super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
             super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl;
    (*pIVar2->_vptr_IExpression[2])(pIVar2,&local_78);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,local_40);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if (pvStack_60 != (void *)0x0) {
    operator_delete(pvStack_60,lStack_50 - (long)pvStack_60);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

explicit NormalVarRefExpression(const std::size_t arity)
        : VarRefExpression{arity}
    {
#if CP_RPN_LOG_EXPR_CREATION
        std::cout << "NormalVarRefExpression(" << arity << ")\n";
#endif
    }